

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

mpc_val_t * mpcf_re_repeat(int n,mpc_val_t **xs)

{
  char cVar1;
  undefined4 uVar2;
  char *__ptr;
  mpc_val_t *pmVar3;
  void *pvVar4;
  mpc_val_t *pmVar5;
  
  __ptr = (char *)xs[1];
  if (__ptr == (char *)0x0) {
    pmVar3 = *xs;
  }
  else {
    cVar1 = *__ptr;
    if (cVar1 == '?') {
      free(__ptr);
      pmVar5 = *xs;
      pmVar3 = calloc(1,0x38);
      *(undefined1 *)((long)pmVar3 + 0x30) = 0x13;
      *(mpc_val_t **)((long)pmVar3 + 8) = pmVar5;
      *(code **)((long)pmVar3 + 0x18) = mpcf_ctor_str;
    }
    else {
      if (cVar1 == '+') {
        free(__ptr);
        pmVar5 = *xs;
        pmVar3 = calloc(1,0x38);
        *(undefined1 *)((long)pmVar3 + 0x30) = 0x15;
      }
      else {
        if (cVar1 != '*') {
          uVar2 = *(undefined4 *)__ptr;
          free(__ptr);
          pmVar3 = *xs;
          pvVar4 = calloc(1,0x38);
          *(undefined1 *)((long)pvVar4 + 0x30) = 0x16;
          *(undefined4 *)((long)pvVar4 + 8) = uVar2;
          *(code **)((long)pvVar4 + 0x10) = mpcf_strfold;
          *(mpc_val_t **)((long)pvVar4 + 0x18) = pmVar3;
          *(code **)((long)pvVar4 + 0x20) = free;
          return pvVar4;
        }
        free(__ptr);
        pmVar5 = *xs;
        pmVar3 = calloc(1,0x38);
        *(undefined1 *)((long)pmVar3 + 0x30) = 0x14;
      }
      *(mpc_val_t **)((long)pmVar3 + 0x18) = pmVar5;
      *(code **)((long)pmVar3 + 0x10) = mpcf_strfold;
    }
  }
  return pmVar3;
}

Assistant:

static mpc_val_t *mpcf_re_repeat(int n, mpc_val_t **xs) {
  int num;
  (void) n;
  if (xs[1] == NULL) { return xs[0]; }
  switch(((char*)xs[1])[0])
  {
    case '*': { free(xs[1]); return mpc_many(mpcf_strfold, xs[0]); }; break;
    case '+': { free(xs[1]); return mpc_many1(mpcf_strfold, xs[0]); }; break;
    case '?': { free(xs[1]); return mpc_maybe_lift(xs[0], mpcf_ctor_str); }; break;
    default:
      num = *(int*)xs[1];
      free(xs[1]);
  }

  return mpc_count(num, mpcf_strfold, xs[0], free);
}